

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsOrientFaceSides(FmsInt num_sides,FmsInt num_faces,FmsInt *face_verts,
                      FmsOrientation *orientations)

{
  bool bVar1;
  uint uVar2;
  FmsInt FVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  FmsInt *pFVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  bool local_96;
  FmsInt aFStack_78 [4];
  ulong auStack_58 [2];
  FmsInt vi [4];
  FmsInt nc [4];
  
  iVar10 = (int)num_sides;
  local_96 = num_faces != 0;
  if (local_96) {
    uVar15 = 1;
    if (1 < iVar10) {
      uVar15 = num_sides & 0xffffffff;
    }
    uVar9 = 0;
    do {
      bVar1 = 0 < (long)num_sides;
      if (0 < (long)num_sides) {
        lVar14 = 1;
        lVar7 = 0;
        iVar11 = iVar10 + -1;
        do {
          lVar4 = (long)((iVar11 % iVar10) * 2);
          FVar3 = face_verts[lVar4];
          if ((FVar3 == *(FmsInt *)((long)face_verts + lVar7 * 2)) ||
             (uVar2 = 0, FVar3 == *(FmsInt *)((long)face_verts + lVar7 * 2 + 8))) {
            *(FmsInt *)((long)aFStack_78 + lVar7) = FVar3;
            uVar2 = 1;
          }
          FVar3 = face_verts[lVar4 + 1];
          if ((face_verts[lVar4] != FVar3) &&
             ((FVar3 == *(FmsInt *)((long)face_verts + lVar7 * 2) ||
              (FVar3 == *(FmsInt *)((long)face_verts + lVar7 * 2 + 8))))) {
            *(FmsInt *)((long)aFStack_78 + lVar7) = FVar3;
            uVar2 = uVar2 + 1;
          }
          *(ulong *)((long)auStack_58 + lVar7) = (ulong)uVar2;
          if (uVar2 == 0) goto LAB_0010546a;
          bVar1 = lVar14 < iVar10;
          lVar7 = lVar7 + 8;
          iVar11 = iVar11 + 1;
          lVar14 = lVar14 + 1;
        } while (uVar15 * 8 - lVar7 != 0);
      }
      if (0 < (long)num_sides) {
        pFVar8 = face_verts + 1;
        uVar12 = 0;
        do {
          uVar13 = uVar12 + 1;
          FVar3 = pFVar8[-1];
          if (FVar3 != *pFVar8) {
            uVar6 = uVar12;
            if (auStack_58[uVar12] != 1) {
              uVar5 = (long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) %
                      (long)iVar10 & 0xffffffff;
              if (auStack_58[uVar5] != 1) goto LAB_0010544e;
              if (auStack_58[uVar12] != 1) {
                FVar3 = *pFVar8;
                uVar6 = uVar5;
              }
            }
            orientations[uVar12] = aFStack_78[uVar6] != FVar3;
          }
LAB_0010544e:
          pFVar8 = pFVar8 + 2;
          uVar12 = uVar13;
        } while (uVar15 != uVar13);
      }
      face_verts = face_verts + (uint)(iVar10 * 2);
      orientations = orientations + (num_sides & 0xffffffff);
LAB_0010546a:
      if (bVar1) break;
      uVar9 = uVar9 + 1;
      local_96 = uVar9 < num_faces;
    } while (uVar9 != num_faces);
  }
  return (uint)local_96;
}

Assistant:

static int FmsOrientFaceSides(FmsInt num_sides, FmsInt num_faces,
                              FmsInt *face_verts,
                              FmsOrientation *orientations) {
  // The size of 'face_verts' must be 2 x 'num_sides' x 'num_faces'.
  // The size of 'orientations' must be 'num_sides' x 'num_faces'.

  // Find edge orientations that if applied to 'face_verts' lead to an array of
  // the form: (a,b,b,c,c,a), for triangles, or (a,b,b,c,c,d,d,a), for quads.
  // If one of the edge orientations cannot be uniquely determined, that edge in
  // the 'orientations' array will remain unmodified, e.g. as initialized by the
  // user.

  const int n = num_sides;
  for (FmsInt k = 0; k < num_faces; k++) {
    FmsInt nc[4], vi[4]; // at most 4 vertices/sides
    for (int i = 0; i < n; i++) {
      nc[i] = FmsIntersectTwoEdges(face_verts+2*((i+n-1)%n),
                                   face_verts+2*i, vi+i);
      if (nc[i] == 0) { E_RETURN(1); }
    }
    for (int ei = 0; ei < n; ei++) {
      int ej = (ei+1)%n;
      if (face_verts[2*ei+0] == face_verts[2*ei+1] ||
          (nc[ei] != 1 && nc[ej] != 1)) {
        // Keep the value of 'orientations[ei]' as is, e.g. as defined by the
        // user.
      } else {
        if (nc[ei] == 1) {
          orientations[ei] = (vi[ei] == face_verts[2*ei+0]) ? 0 : 1;
        } else {
          orientations[ei] = (vi[ej] == face_verts[2*ei+1]) ? 0 : 1;
        }
      }
    }
    face_verts += 2*n;
    orientations += n;
  }
  return 0;
}